

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

size_t __thiscall TimeStampReq::SetDataSize(TimeStampReq *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  uVar1 = (this->version).super_DerBase.cbData;
  lVar10 = 2;
  lVar9 = 2;
  if (((((0x7f < uVar1) && (lVar9 = 3, 0xff < uVar1)) && (lVar9 = 4, 0xffff < uVar1)) &&
      ((lVar9 = 5, 0xffffff < uVar1 && (lVar9 = 6, uVar1 >> 0x20 != 0)))) &&
     (lVar9 = 7, uVar1 >> 0x28 != 0)) {
    lVar9 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  uVar2 = (this->messageImprint).super_DerBase.cbData;
  if (((0x7f < uVar2) && (lVar10 = 3, 0xff < uVar2)) &&
     ((lVar10 = 4, 0xffff < uVar2 &&
      (((lVar10 = 5, 0xffffff < uVar2 && (lVar10 = 6, uVar2 >> 0x20 != 0)) &&
       (lVar10 = 7, uVar2 >> 0x28 != 0)))))) {
    lVar10 = (ulong)(uVar2 >> 0x30 == 0) << 3;
  }
  uVar3 = (this->reqPolicy).super_DerBase.cbData;
  lVar7 = 2;
  lVar11 = 2;
  if (((0x7f < uVar3) && (lVar11 = 3, 0xff < uVar3)) &&
     (((lVar11 = 4, 0xffff < uVar3 &&
       ((lVar11 = 5, 0xffffff < uVar3 && (lVar11 = 6, uVar3 >> 0x20 != 0)))) &&
      (lVar11 = 7, uVar3 >> 0x28 != 0)))) {
    lVar11 = (ulong)(uVar3 >> 0x30 == 0) << 3;
  }
  uVar4 = (this->nonce).super_DerBase.cbData;
  if ((((0x7f < uVar4) && (lVar7 = 3, 0xff < uVar4)) && (lVar7 = 4, 0xffff < uVar4)) &&
     (((lVar7 = 5, 0xffffff < uVar4 && (lVar7 = 6, uVar4 >> 0x20 != 0)) &&
      (lVar7 = 7, uVar4 >> 0x28 != 0)))) {
    lVar7 = (ulong)(uVar4 >> 0x30 == 0) << 3;
  }
  uVar5 = (this->certReq).super_DerBase.cbData;
  lVar12 = 2;
  lVar13 = 2;
  if (((0x7f < uVar5) && (lVar13 = 3, 0xff < uVar5)) &&
     ((lVar13 = 4, 0xffff < uVar5 &&
      (((lVar13 = 5, 0xffffff < uVar5 && (lVar13 = 6, uVar5 >> 0x20 != 0)) &&
       (lVar13 = 7, uVar5 >> 0x28 != 0)))))) {
    lVar13 = (ulong)(uVar5 >> 0x30 == 0) << 3;
  }
  uVar6 = (this->extensions).super_DerBase.cbData;
  if ((((0x7f < uVar6) && (lVar12 = 3, 0xff < uVar6)) &&
      ((lVar12 = 4, 0xffff < uVar6 &&
       ((lVar12 = 5, 0xffffff < uVar6 && (lVar12 = 6, uVar6 >> 0x20 != 0)))))) &&
     (lVar12 = 7, uVar6 >> 0x28 != 0)) {
    lVar12 = (ulong)(uVar6 >> 0x30 == 0) << 3;
  }
  sVar8 = lVar7 + uVar5 + lVar13 + uVar6 + uVar3 + lVar11 + uVar4 + uVar2 + lVar10 + lVar9 + uVar1 +
          lVar12;
  (this->super_DerBase).cbData = sVar8;
  return sVar8;
}

Assistant:

virtual size_t EncodedSize() const
	{
		// No longer calling SetDataSize here
		// If the object is already fully loaded, then we know cbData, and don't need to 
		// take the perf hit of recalculating it.
		// If it has been set some other way, say we're building the object 
		// directly, then call SetDataSize when you're done.
		return 1 + GetSizeBytes(cbData) + cbData;
	}